

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaRoberts_dns.c
# Opt level: O0

int grob(sunrealtype t,N_Vector yy,N_Vector yp,sunrealtype *gout,void *user_data)

{
  double dVar1;
  double *pdVar2;
  double *in_RDX;
  undefined8 in_RDI;
  sunrealtype y3;
  sunrealtype y1;
  sunrealtype *yval;
  
  pdVar2 = (double *)N_VGetArrayPointer(in_RDI);
  dVar1 = pdVar2[2];
  *in_RDX = *pdVar2 - 0.0001;
  in_RDX[1] = dVar1 - 0.01;
  return 0;
}

Assistant:

static int grob(sunrealtype t, N_Vector yy, N_Vector yp, sunrealtype* gout,
                void* user_data)
{
  sunrealtype *yval, y1, y3;

  yval    = N_VGetArrayPointer(yy);
  y1      = yval[0];
  y3      = yval[2];
  gout[0] = y1 - SUN_RCONST(0.0001);
  gout[1] = y3 - SUN_RCONST(0.01);

  return (0);
}